

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O0

void __thiscall
la::LevenshteinDFA::Search
          (LevenshteinDFA *this,trie_tree *trie,int start,trie_node *node,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  char cVar1;
  int iVar2;
  trie_tree *ptVar3;
  bool bVar4;
  iterator __first;
  iterator __last;
  pair<int,_char> pVar5;
  mapped_type *pmVar6;
  reference pptVar7;
  reference pcVar8;
  mapped_type *pmVar9;
  byte local_d1;
  _Self local_d0;
  _Self local_c8;
  iterator it_2;
  bool found;
  _Node_iterator_base<std::pair<const_int,_int>,_false> _Stack_b8;
  int i_1;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_b0;
  iterator it;
  iterator iStack_a0;
  int i;
  _Self local_98;
  iterator it2;
  key_type local_80;
  pair<int,_char> pair;
  _Self local_70;
  iterator it_1;
  list<char,_std::allocator<char>_> inputs;
  _Self local_38;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_30;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output_local;
  trie_node *node_local;
  trie_tree *ptStack_18;
  int start_local;
  trie_tree *trie_local;
  LevenshteinDFA *this_local;
  
  local_30 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output;
  output_local = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)node;
  node_local._4_4_ = start;
  ptStack_18 = trie;
  trie_local = (trie_tree *)this;
  __first = std::__cxx11::list<int,_std::allocator<int>_>::begin(&this->_finalStates);
  __last = std::__cxx11::list<int,_std::allocator<int>_>::end(&this->_finalStates);
  local_38._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<int>,int>
                 (__first._M_node,__last._M_node,(int *)((long)&node_local + 4));
  inputs.super__List_base<char,_std::allocator<char>_>._M_impl._M_node._M_size =
       (size_t)std::__cxx11::list<int,_std::allocator<int>_>::end(&this->_finalStates);
  bVar4 = std::operator==(&local_38,
                          (_Self *)&inputs.super__List_base<char,_std::allocator<char>_>._M_impl.
                                    _M_node._M_size);
  local_d1 = 0;
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    local_d1 = *(byte *)&output_local[0xd].
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev;
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              (local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &output_local[0xd].
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
  }
  std::__cxx11::list<char,_std::allocator<char>_>::list((list<char,_std::allocator<char>_> *)&it_1);
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::list<char,_std::allocator<char>_>::begin(&this->_uniqueChars);
  while( true ) {
    pair = (pair<int,_char>)
           std::__cxx11::list<char,_std::allocator<char>_>::end(&this->_uniqueChars);
    bVar4 = std::operator==(&local_70,(_Self *)&pair);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    pcVar8 = std::_List_iterator<char>::operator*(&local_70);
    pVar5 = std::make_pair<int&,char&>((int *)((long)&node_local + 4),pcVar8);
    local_80.first = pVar5.first;
    local_80.second = pVar5.second;
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
         ::find(&this->_transTable,&local_80);
    iStack_a0 = std::
                map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
                ::end(&this->_transTable);
    bVar4 = std::operator==(&local_98,&stack0xffffffffffffff60);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      pcVar8 = std::_List_iterator<char>::operator*(&local_70);
      std::__cxx11::list<char,std::allocator<char>>::emplace_back<char&>
                ((list<char,std::allocator<char>> *)&it_1,pcVar8);
      for (it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ = 0;
          it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ < 0x28;
          it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ =
               it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ + 1) {
        pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                            ((array<la::trie_node_*,_40UL> *)output_local,
                             (long)it.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                   _M_cur._4_4_);
        if (*pptVar7 != (value_type)0x0) {
          pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                              ((array<la::trie_node_*,_40UL> *)output_local,
                               (long)it.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                     _M_cur._4_4_);
          cVar1 = (*pptVar7)->_key;
          pcVar8 = std::_List_iterator<char>::operator*(&local_70);
          ptVar3 = ptStack_18;
          if (cVar1 == *pcVar8) {
            pmVar6 = std::
                     map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
                     ::at(&this->_transTable,&local_80);
            iVar2 = *pmVar6;
            pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                                ((array<la::trie_node_*,_40UL> *)output_local,
                                 (long)it.
                                       super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                       _M_cur._4_4_);
            Search(this,ptVar3,iVar2,*pptVar7,
                   (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30);
          }
        }
      }
    }
    std::_List_iterator<char>::operator++(&local_70);
  }
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::find(&this->_defaultTrans,(key_type *)((long)&node_local + 4));
  _Stack_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::end(&this->_defaultTrans);
  bVar4 = std::__detail::operator==(&local_b0,&stack0xffffffffffffff48);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    for (it_2._M_node._4_4_ = 0; it_2._M_node._4_4_ < 0x28;
        it_2._M_node._4_4_ = it_2._M_node._4_4_ + 1) {
      it_2._M_node._3_1_ = 0;
      pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                          ((array<la::trie_node_*,_40UL> *)output_local,(long)it_2._M_node._4_4_);
      if (*pptVar7 != (value_type)0x0) {
        local_c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<char,_std::allocator<char>_>::begin
                       ((list<char,_std::allocator<char>_> *)&it_1);
        while( true ) {
          local_d0._M_node =
               (_List_node_base *)
               std::__cxx11::list<char,_std::allocator<char>_>::end
                         ((list<char,_std::allocator<char>_> *)&it_1);
          bVar4 = std::operator==(&local_c8,&local_d0);
          ptVar3 = ptStack_18;
          if (((bVar4 ^ 0xffU) & 1) == 0) break;
          pcVar8 = std::_List_iterator<char>::operator*(&local_c8);
          cVar1 = *pcVar8;
          pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                              ((array<la::trie_node_*,_40UL> *)output_local,(long)it_2._M_node._4_4_
                              );
          if (cVar1 == (*pptVar7)->_key) {
            it_2._M_node._3_1_ = 1;
          }
          std::_List_iterator<char>::operator++(&local_c8);
        }
        if ((it_2._M_node._3_1_ & 1) == 0) {
          pmVar9 = std::
                   unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::at(&this->_defaultTrans,(key_type *)((long)&node_local + 4));
          iVar2 = *pmVar9;
          pptVar7 = std::array<la::trie_node_*,_40UL>::operator[]
                              ((array<la::trie_node_*,_40UL> *)output_local,(long)it_2._M_node._4_4_
                              );
          Search(this,ptVar3,iVar2,*pptVar7,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
        }
      }
    }
  }
  std::__cxx11::list<char,_std::allocator<char>_>::~list((list<char,_std::allocator<char>_> *)&it_1)
  ;
  return;
}

Assistant:

void LevenshteinDFA::Search(const trie_tree &trie, int start, trie_node * node, std::list<std::string> &output)
    {
        /**/
        if (std::find(_finalStates.begin(), _finalStates.end(), start) != _finalStates.end() &&node->_is_end_word )
        {
            output.emplace_back(node->_value);
        }
        std::list<char> inputs;
        for (std::list<char>::iterator it = _uniqueChars.begin(); it != _uniqueChars.end();++it)
        {
            std::pair<int, char> pair = std::make_pair(start, *it);
            auto it2 = _transTable.find(pair);
            if (it2 != _transTable.end())
            {
                inputs.emplace_back(*it);
                for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
                {
                    if (node->_children[i] == NULL)
                        continue;
                    if (node->_children[i]->_key == *it)
                    {
                        Search(trie, _transTable.at(pair), node->_children[i], output);
                    }
                }
            }
        }
        auto it = _defaultTrans.find(start);
        if (it != _defaultTrans.end())
        {
            for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
            {
                bool found = false;;
                if (node->_children[i] == NULL) continue;
                for (std::list<char>::iterator it = inputs.begin(); it != inputs.end();++it)
                {
                    if (*it == node->_children[i]->_key)
                    {
                        found = true;
                    }
                }
                if (!found)
                {
                    Search(trie, _defaultTrans.at(start), node->_children[i], output);
                }
            }
        }

    }